

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O0

void jpc_pchglist_destroy(jpc_pchglist_t *pchglist)

{
  int local_14;
  int pchgno;
  jpc_pchglist_t *pchglist_local;
  
  if (pchglist->pchgs != (jpc_pchg_t **)0x0) {
    for (local_14 = 0; local_14 < pchglist->numpchgs; local_14 = local_14 + 1) {
      jpc_pchg_destroy(pchglist->pchgs[local_14]);
    }
    jas_free(pchglist->pchgs);
  }
  jas_free(pchglist);
  return;
}

Assistant:

void jpc_pchglist_destroy(jpc_pchglist_t *pchglist)
{
	int pchgno;
	if (pchglist->pchgs) {
		for (pchgno = 0; pchgno < pchglist->numpchgs; ++pchgno) {
			jpc_pchg_destroy(pchglist->pchgs[pchgno]);
		}
		jas_free(pchglist->pchgs);
	}
	jas_free(pchglist);
}